

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
::encode_mapped_value
          (jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
           *this,int32_t k,int32_t mapped_error,int32_t limit)

{
  int local_20;
  int32_t high_bits;
  int32_t limit_local;
  int32_t mapped_error_local;
  int32_t k_local;
  jls_codec<charls::default_traits<unsigned_short,_charls::triplet<unsigned_short>_>,_charls::encoder_strategy>
  *this_local;
  
  local_20 = mapped_error >> ((byte)k & 0x1f);
  if (local_20 < (limit - (this->traits_).quantized_bits_per_pixel) + -1) {
    if (0x1f < local_20 + 1) {
      encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,0,local_20 / 2);
      local_20 = local_20 - local_20 / 2;
    }
    encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,1,local_20 + 1);
    encoder_strategy::append_to_bit_stream
              (&this->super_encoder_strategy,mapped_error & (1 << ((byte)k & 0x1f)) - 1U,k);
  }
  else {
    if (limit - (this->traits_).quantized_bits_per_pixel < 0x20) {
      encoder_strategy::append_to_bit_stream
                (&this->super_encoder_strategy,1,limit - (this->traits_).quantized_bits_per_pixel);
    }
    else {
      encoder_strategy::append_to_bit_stream(&this->super_encoder_strategy,0,0x1f);
      encoder_strategy::append_to_bit_stream
                (&this->super_encoder_strategy,1,
                 (limit - (this->traits_).quantized_bits_per_pixel) + -0x1f);
    }
    encoder_strategy::append_to_bit_stream
              (&this->super_encoder_strategy,
               mapped_error - 1U &
               (1 << ((byte)(this->traits_).quantized_bits_per_pixel & 0x1f)) - 1U,
               (this->traits_).quantized_bits_per_pixel);
  }
  return;
}

Assistant:

FORCE_INLINE void encode_mapped_value(const int32_t k, const int32_t mapped_error, const int32_t limit)
    {
        int32_t high_bits{mapped_error >> k};

        if (high_bits < limit - traits_.quantized_bits_per_pixel - 1)
        {
            if (high_bits + 1 > 31)
            {
                Strategy::append_to_bit_stream(0, high_bits / 2);
                high_bits = high_bits - high_bits / 2;
            }
            Strategy::append_to_bit_stream(1, high_bits + 1);
            Strategy::append_to_bit_stream((mapped_error & ((1 << k) - 1)), k);
            return;
        }

        if (limit - traits_.quantized_bits_per_pixel > 31)
        {
            Strategy::append_to_bit_stream(0, 31);
            Strategy::append_to_bit_stream(1, limit - traits_.quantized_bits_per_pixel - 31);
        }
        else
        {
            Strategy::append_to_bit_stream(1, limit - traits_.quantized_bits_per_pixel);
        }
        Strategy::append_to_bit_stream((mapped_error - 1) & ((1 << traits_.quantized_bits_per_pixel) - 1),
                                       traits_.quantized_bits_per_pixel);
    }